

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O3

void prng_seed_finish(prng *pr)

{
  long *plVar1;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var2;
  uint64_t uVar3;
  uchar buf [114];
  undefined1 auStack_88 [120];
  
  plVar1 = (long *)pr[2].savesize;
  if (plVar1 == (long *)0x0) {
    __assert_fail("pi->keymaker",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                  0xb2,"void prng_seed_finish(prng *)");
  }
  (**(code **)(*plVar1 + 0x18))(plVar1,auStack_88);
  (**(code **)(*plVar1 + 0x20))(plVar1);
  pr[2].savesize = 0;
  if (pr[1].binarysink_[0].write == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0) {
    p_Var2 = (_func_void_BinarySink_ptr_void_ptr_size_t *)(**(code **)pr[1].savesize)();
    if (p_Var2 != (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0) {
      (**(code **)(*(long *)p_Var2 + 8))(p_Var2);
    }
    pr[1].binarysink_[0].write = p_Var2;
    BinarySink_put_data(*(BinarySink **)(p_Var2 + 8),auStack_88,*(size_t *)(pr[1].savesize + 0x28));
    pr[0xc].binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40;
    uVar3 = prng_reseed_time_ms();
    pr[0xd].savesize = uVar3;
    smemclr(auStack_88,0x72);
    return;
  }
  __assert_fail("!pi->generator",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                0xc0,"void prng_seed_finish(prng *)");
}

Assistant:

void prng_seed_finish(prng *pr)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);
    unsigned char buf[MAX_HASH_LEN];

    assert(pi->keymaker);

    prngdebug("prng: reseed finish\n");

    /*
     * Actually generate the key.
     */
    ssh_hash_final(pi->keymaker, buf);
    pi->keymaker = NULL;

    /*
     * Load that key into a fresh hash instance, which will become the
     * new generator.
     */
    assert(!pi->generator);
    pi->generator = ssh_hash_new(pi->hashalg);
    put_data(pi->generator, buf, pi->hashalg->hlen);

    pi->until_reseed = RESEED_DATA_SIZE;
    pi->last_reseed_time = prng_reseed_time_ms();

    smemclr(buf, sizeof(buf));
}